

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

int Saig_ManBmcTerSimCount01(Aig_Man_t *p,uint *pInfo)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  
  if (pInfo == (uint *)0x0) {
    iVar3 = p->nRegs;
  }
  else {
    iVar3 = 0;
    for (iVar4 = 0; iVar4 < p->nRegs; iVar4 = iVar4 + 1) {
      pvVar2 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar4);
      iVar1 = Aig_ObjIsConst1((Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe));
      if (iVar1 == 0) {
        iVar3 = (iVar3 + 1) -
                (uint)((~(pInfo[*(int *)((long)pvVar2 + 0x24) >> 4] >>
                         ((char)*(int *)((long)pvVar2 + 0x24) * '\x02' & 0x1fU)) & 3) == 0);
      }
    }
  }
  return iVar3;
}

Assistant:

int Saig_ManBmcTerSimCount01( Aig_Man_t * p, unsigned * pInfo )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    if ( pInfo == NULL )
        return Saig_ManRegNum(p);
    Saig_ManForEachLi( p, pObj, i )
        if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            Counter += (Saig_ManBmcSimInfoGet(pInfo, pObj) != SAIG_TER_UND);
    return Counter;
}